

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_Mesh * __thiscall ON_Mesh::DuplicateFace(ON_Mesh *this,int face_index,ON_Mesh *mesh)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  ON_MeshFace *pOVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int vertex_count;
  uint uVar11;
  long lVar12;
  int vi;
  ON_3dPoint *V;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  ON_MeshFace f;
  ON_MeshFace local_78;
  ON_SimpleArray<ON_2dPoint> *local_68;
  ON_SimpleArray<ON_Color> *local_60;
  ON_SimpleArray<ON_2fPoint> *local_58;
  ON_3dPoint *local_50;
  ON_SimpleArray<ON_3dPoint> *local_48;
  ON_SimpleArray<ON_3fPoint> *local_40;
  ON_3dPoint *local_38;
  
  if (mesh != this) {
    if (mesh != (ON_Mesh *)0x0) {
      Destroy(mesh);
    }
    iVar1 = (this->m_F).m_count;
    if (iVar1 <= face_index || face_index < 0) {
      return (ON_Mesh *)0x0;
    }
    uVar11 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    if (uVar11 < 3) {
      return (ON_Mesh *)0x0;
    }
    local_50 = (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a;
    bVar14 = local_50 != (ON_3dPoint *)0x0;
    V = (ON_3dPoint *)0x0;
    bVar15 = uVar11 != (this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count;
    if (bVar15) {
      local_50 = V;
    }
    bVar10 = 0 < (int)uVar11;
    bVar6 = (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count == uVar11 && bVar10;
    bVar7 = (this->m_C).m_count == uVar11 && bVar10;
    bVar8 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == uVar11 && bVar10;
    bVar9 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == uVar11 && bVar10;
    bVar10 = (this->m_K).m_count == uVar11 && bVar10;
    uVar4 = (ulong)(uint)face_index;
    if (bVar15 || !bVar14) {
      V = (ON_3dPoint *)(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
    }
    iVar2 = (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count;
    pOVar5 = (this->m_F).m_a + uVar4;
    local_78.vi._0_8_ = *(undefined8 *)pOVar5->vi;
    local_78.vi._8_8_ = *(undefined8 *)(pOVar5->vi + 2);
    if (!bVar15 && bVar14) {
      bVar3 = ON_MeshFace::IsValid(&local_78,uVar11,local_50);
      if (bVar3) goto LAB_0050e622;
      bVar3 = ON_MeshFace::Repair(&local_78,uVar11,local_50);
    }
    else {
      if (V == (ON_3dPoint *)0x0) {
        return (ON_Mesh *)0x0;
      }
      bVar3 = ON_MeshFace::IsValid(&local_78,uVar11,(ON_3fPoint *)V);
      if (bVar3) goto LAB_0050e622;
      bVar3 = ON_MeshFace::Repair(&local_78,uVar11,(ON_3fPoint *)V);
    }
    if (bVar3 != false) {
LAB_0050e622:
      local_58 = (ON_SimpleArray<ON_2fPoint> *)CONCAT44(local_58._4_4_,local_78.vi[2]);
      local_60 = (ON_SimpleArray<ON_Color> *)CONCAT44(local_60._4_4_,local_78.vi[3]);
      bVar3 = local_78.vi[2] != local_78.vi[3];
      local_68 = (ON_SimpleArray<ON_2dPoint> *)uVar4;
      if (mesh == (ON_Mesh *)0x0) {
        mesh = (ON_Mesh *)operator_new(0x6e0);
        ON_Mesh(mesh);
      }
      uVar11 = bVar3 + 3;
      uVar4 = (ulong)uVar11;
      if (!bVar15 && bVar14) {
        local_48 = &(mesh->m_dV).super_ON_SimpleArray<ON_3dPoint>;
        if ((uint)(mesh->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_capacity < uVar11) {
          ON_SimpleArray<ON_3dPoint>::SetCapacity(local_48,uVar4);
        }
      }
      else {
        local_48 = (ON_SimpleArray<ON_3dPoint> *)0x0;
      }
      local_40 = &(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>;
      if ((uint)(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_capacity < uVar11) {
        ON_SimpleArray<ON_3fPoint>::SetCapacity(local_40,uVar4);
      }
      local_38 = V;
      if ((mesh->m_F).m_capacity == 0) {
        ON_SimpleArray<ON_MeshFace>::SetCapacity(&mesh->m_F,1);
      }
      bVar3 = (int)local_58 == (int)local_60;
      pOVar5 = ON_SimpleArray<ON_MeshFace>::AppendNew(&mesh->m_F);
      pOVar5->vi[0] = 0;
      pOVar5->vi[1] = 1;
      pOVar5->vi[2] = 2;
      pOVar5->vi[3] = bVar3 ^ 3;
      if (iVar2 == iVar1) {
        if ((mesh->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity == 0) {
          ON_SimpleArray<ON_3fVector>::SetCapacity
                    (&(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>,1);
        }
        ON_SimpleArray<ON_3fVector>::Append
                  (&(mesh->m_FN).super_ON_SimpleArray<ON_3fVector>,
                   (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a + (long)local_68);
      }
      if ((bVar6) && ((uint)(mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_capacity < uVar11)) {
        ON_SimpleArray<ON_3fVector>::SetCapacity
                  (&(mesh->m_N).super_ON_SimpleArray<ON_3fVector>,uVar4);
      }
      if ((bVar8) && ((uint)(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_capacity < uVar11)) {
        ON_SimpleArray<ON_2fPoint>::SetCapacity(&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,uVar4)
        ;
      }
      if ((bVar7) && ((uint)(mesh->m_C).m_capacity < uVar11)) {
        ON_SimpleArray<ON_Color>::SetCapacity(&mesh->m_C,uVar4);
      }
      if ((bVar9) && ((uint)(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity < uVar11)) {
        ON_SimpleArray<ON_2dPoint>::SetCapacity(&(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,uVar4)
        ;
      }
      if ((bVar10) && ((uint)(mesh->m_K).m_capacity < uVar11)) {
        ON_SimpleArray<ON_SurfaceCurvature>::SetCapacity(&mesh->m_K,uVar4);
      }
      local_58 = &(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>;
      local_60 = &mesh->m_C;
      local_68 = &(mesh->m_S).super_ON_SimpleArray<ON_2dPoint>;
      uVar13 = 0;
      do {
        lVar12 = (long)local_78.vi[uVar13];
        if (!bVar15 && bVar14) {
          ON_SimpleArray<ON_3dPoint>::Append(local_48,local_50 + lVar12);
        }
        else {
          ON_SimpleArray<ON_3fPoint>::Append
                    (local_40,(ON_3fPoint *)((long)&local_38->x + lVar12 * 0xc));
        }
        if (bVar6) {
          ON_SimpleArray<ON_3fVector>::Append
                    (&(mesh->m_N).super_ON_SimpleArray<ON_3fVector>,
                     (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a + lVar12);
        }
        if (bVar8) {
          ON_SimpleArray<ON_2fPoint>::Append
                    (local_58,(this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a + lVar12);
        }
        if (bVar7) {
          ON_SimpleArray<ON_Color>::Append(local_60,(this->m_C).m_a + lVar12);
        }
        if (bVar9) {
          ON_SimpleArray<ON_2dPoint>::Append
                    (local_68,(this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a + lVar12);
        }
        if (bVar10) {
          ON_SimpleArray<ON_SurfaceCurvature>::Append(&mesh->m_K,(this->m_K).m_a + lVar12);
        }
        uVar13 = uVar13 + 1;
      } while (uVar4 != uVar13);
      if (!bVar15 && bVar14) {
        UpdateSinglePrecisionVertices(mesh);
        return mesh;
      }
      return mesh;
    }
  }
  return (ON_Mesh *)0x0;
}

Assistant:

ON_Mesh* ON_Mesh::DuplicateFace( int face_index, ON_Mesh* mesh ) const
{
  if ( mesh == this )
    return nullptr;
  if ( 0 != mesh )
    mesh->Destroy();
  if ( face_index < 0 || face_index >= m_F.Count() )
    return nullptr;
  const unsigned int vcnt = VertexUnsignedCount();
  if ( vcnt < 3 )
    return nullptr;

  const ON_3dPoint* dV = ( vcnt == m_dV.UnsignedCount() ) ? m_dV.Array() : nullptr;
  const ON_3fPoint* fV = (nullptr == dV && vcnt == m_V.UnsignedCount() ) ? m_V.Array() : nullptr;
  bool bHasFaceNormals = HasFaceNormals();
  bool bHasVertexNormals = HasVertexNormals();
  bool bHasVertexColors = HasVertexColors();
  bool bHasTextureCoordinates = HasTextureCoordinates();
  bool bHasSurfaceParameters = HasSurfaceParameters();
  bool bHasPrincipalCurvatures = HasPrincipalCurvatures();

  ON_MeshFace f = m_F[face_index];
  if ( nullptr != dV )
  {
    if ( !f.IsValid(vcnt,dV) )
    {
      // invalid vertex indices - see if it can be fixed
      if ( !f.Repair(vcnt,dV) )
        return nullptr;
    }
  }
  else if (nullptr != fV)
  {
    if (!f.IsValid(vcnt, fV))
    {
      // invalid vertex indices - see if it can be fixed
      if (!f.Repair(vcnt, fV))
        return nullptr;
    }
  }
  else
    return nullptr;

  const int newvcnt = f.IsTriangle() ? 3 : 4;
  if ( 0 == mesh )
    mesh = new ON_Mesh();
  ON_3dPointArray* newdV = 0;
  if ( dV )
  {
    newdV = &mesh->m_dV;
    newdV->Reserve(newvcnt);
  }
  mesh->m_V.Reserve(newvcnt);
  mesh->m_F.Reserve(1);
  ON_MeshFace& newface = mesh->m_F.AppendNew();
  newface.vi[0] = 0;
  newface.vi[1] = 1;
  newface.vi[2] = 2;
  newface.vi[3] = (4 == newvcnt) ? 3 : newface.vi[2];

  if ( bHasFaceNormals )
  {
    mesh->m_FN.Reserve(1);
    mesh->m_FN.Append(m_FN[face_index]);
  }

  if ( bHasVertexNormals )
    mesh->m_N.Reserve(newvcnt);
  if ( bHasTextureCoordinates )
    mesh->m_T.Reserve(newvcnt);
  if ( bHasVertexColors )
    mesh->m_C.Reserve(newvcnt);
  if ( bHasSurfaceParameters )
    mesh->m_S.Reserve(newvcnt);
  if ( bHasPrincipalCurvatures )
    mesh->m_K.Reserve(newvcnt);
  for ( int vi = 0; vi < newvcnt; vi++ )
  {
    if ( dV )
      newdV->Append(dV[f.vi[vi]]);
    else
      mesh->m_V.Append(fV[f.vi[vi]]);
    if ( bHasVertexNormals )
      mesh->m_N.Append(m_N[f.vi[vi]]);
    if ( bHasTextureCoordinates )
      mesh->m_T.Append(m_T[f.vi[vi]]);
    if ( bHasVertexColors )
      mesh->m_C.Append(m_C[f.vi[vi]]);
    if ( bHasSurfaceParameters )
      mesh->m_S.Append(m_S[f.vi[vi]]);
    if ( bHasPrincipalCurvatures )
      mesh->m_K.Append(m_K[f.vi[vi]]);
  }
  if ( nullptr != dV )
    mesh->UpdateSinglePrecisionVertices();

  return mesh;
}